

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV4MeshBones(Parser *this,uint iNumBones,Mesh *mesh)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  byte *in;
  int local_78;
  allocator local_71;
  value_type local_70;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,"UNNAMED",&local_71);
  std::__cxx11::string::string((string *)&local_70,local_50);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::resize
            (&mesh->mBones,(ulong)iNumBones,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  local_78 = 0;
  do {
    while( true ) {
      in = (byte *)this->filePtr;
      bVar2 = *in;
      if (bVar2 != 0x2a) break;
      this->filePtr = (char *)(in + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_NAME",0xe);
      if (!bVar1) {
        in = (byte *)this->filePtr;
LAB_003e7fe1:
        bVar2 = *in;
        break;
      }
      bVar1 = SkipSpaces<char>(&this->filePtr);
      in = (byte *)this->filePtr;
      if (!bVar1) goto LAB_003e7fe1;
      uVar3 = strtoul10((char *)in,&this->filePtr);
      if (uVar3 < iNumBones) {
        bVar1 = ParseString(this,&(mesh->mBones).
                                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar3].mName,
                            "*MESH_BONE_NAME");
        if (!bVar1) {
          SkipToNextToken(this);
        }
      }
      else {
        LogWarning(this,"Bone index is out of bounds");
      }
    }
    if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e8025;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar2 == 0x7b) {
        local_78 = local_78 + 1;
      }
      else if (bVar2 == 0x7d) {
        local_78 = local_78 + -1;
        if (local_78 == 0) {
          this->filePtr = (char *)(in + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar2 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_LIST chunk (Level 3)");
      }
LAB_003e8025:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(in + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBones(unsigned int iNumBones,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBones.resize(iNumBones, Bone("UNNAMED"));
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone with name ...
            if (TokenMatch(filePtr,"MESH_BONE_NAME" ,14))
            {
                // parse an index ...
                if(SkipSpaces(&filePtr))
                {
                    unsigned int iIndex = strtoul10(filePtr,&filePtr);
                    if (iIndex >= iNumBones)
                    {
                        LogWarning("Bone index is out of bounds");
                        continue;
                    }
                    if (!ParseString(mesh.mBones[iIndex].mName,"*MESH_BONE_NAME"))
                        SkipToNextToken();
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_BONE_LIST");
    }
}